

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superfamiconv.cpp
# Opt level: O3

int superfamiconv(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 uVar9;
  pointer pIVar10;
  pointer pSVar11;
  undefined5 uVar12;
  undefined5 uVar13;
  undefined3 uVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer poVar18;
  char **argv_00;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  Mode MVar22;
  int iVar23;
  runtime_error *prVar24;
  undefined4 uVar25;
  Mode extraout_EDX;
  Mode extraout_EDX_00;
  Mode extraout_EDX_01;
  Mode MVar26;
  ulong uVar27;
  _Base_ptr p_Var28;
  uint uVar29;
  Image *crop;
  pointer image;
  _Base_ptr p_Var30;
  _Base_ptr p_Var31;
  _Base_ptr p_Var32;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar33;
  uint uVar34;
  ulong uVar35;
  pointer poVar36;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar37;
  bool bVar38;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  string_view fmt_14;
  string_view fmt_15;
  string_view fmt_16;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt_17;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  string_view fmt_18;
  string_view fmt_19;
  format_args args_15;
  format_args args_16;
  bool verbose;
  string mode_str;
  Image palette_image;
  vector<sfc::Image,_std::allocator<sfc::Image>_> crops;
  bool help;
  bool license;
  bool local_da9;
  ulong local_da8;
  undefined8 uStack_da0;
  undefined1 local_d98 [32];
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> local_d78;
  undefined1 local_d58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d48;
  pointer local_d38;
  undefined8 local_d30;
  pointer puStack_d28;
  _Base_ptr local_d20;
  _Base_ptr local_d18;
  _Base_ptr p_Stack_d10;
  pointer local_d08;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_d00;
  vector<sfc::Image,_std::allocator<sfc::Image>_> local_cc8;
  Palette local_ca8;
  undefined1 local_c78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  pointer local_c58;
  pointer local_c50;
  pointer puStack_c48;
  _Base_ptr local_c40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c38;
  pointer poStack_c20;
  pointer local_c18;
  _Base_ptr p_Stack_c10;
  _Base_ptr local_c08;
  _Base_ptr p_Stack_c00;
  _Base_ptr local_bf8;
  _Base_ptr local_bf0;
  _Base_ptr local_be8;
  size_t local_be0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_bd8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_ba8;
  int local_b78;
  _Alloc_hider local_b70;
  size_type local_b68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b60;
  undefined1 local_b48 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  undefined1 local_a88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  undefined8 local_a48;
  uint uStack_a40;
  uint uStack_a3c;
  bool bStack_a38;
  bool bStack_a37;
  bool abStack_a36 [2];
  int local_a34 [2];
  bool local_a2c [4];
  string local_a28;
  Map local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9d8;
  char **local_9d0;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<sfc::Image,_std::allocator<sfc::Image>_> local_48;
  
  local_b48._0_8_ = local_b48 + 0x10;
  local_b48._8_8_ = (pointer)0x0;
  local_b48[0x10] = '\0';
  local_b48._32_8_ = local_b48 + 0x30;
  local_b48._40_8_ = (pointer)0x0;
  local_b48[0x30] = '\0';
  local_b48._64_8_ = local_b48 + 0x50;
  local_b48._72_8_ = (pointer)0x0;
  local_b48[0x50] = '\0';
  local_b48._96_8_ = local_b48 + 0x70;
  local_b48._104_8_ = (pointer)0x0;
  local_b48[0x70] = '\0';
  local_b48._128_8_ = local_b48 + 0x90;
  local_b48._136_8_ = (Image *)0x0;
  local_b48[0x90] = '\0';
  local_aa8._M_dataplus._M_p = (pointer)&local_aa8.field_2;
  local_aa8._M_string_length = 0;
  local_aa8.field_2._M_local_buf[0] = '\0';
  local_a88._0_8_ = local_a88 + 0x10;
  local_a88._8_8_ = (Image *)0x0;
  local_a88[0x10] = '\0';
  local_a68._M_dataplus._M_p = (pointer)&local_a68.field_2;
  local_a68._M_string_length = 0;
  local_a68.field_2._M_local_buf[0] = '\0';
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  bStack_a38 = false;
  bStack_a37 = false;
  abStack_a36[0] = false;
  local_a48 = 0;
  uStack_a40 = 0;
  uStack_a3c = 0;
  local_a2c[0] = false;
  local_a34[0] = 0;
  local_a34[1] = 0;
  local_a28._M_string_length = 0;
  local_a28.field_2._M_local_buf[0] = '\0';
  local_da9 = false;
  local_d98._0_8_ = local_d98 + 0x10;
  local_d98._8_4_ = 0;
  local_d98._12_4_ = 0;
  local_d98._16_4_ = local_d98._16_4_ & 0xffffff00;
  local_c78._0_8_ = local_c78 + 0x10;
  local_c78._8_8_ = (pointer)0x0;
  local_c68._M_allocated_capacity = local_c68._M_allocated_capacity & 0xffffffffffffff00;
  local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&puStack_c48;
  puStack_c48 = (pointer)((ulong)puStack_c48 & 0xffffffff00000000);
  local_c40 = (_Base_ptr)0x0;
  local_bf0 = (_Base_ptr)&p_Stack_c00;
  p_Stack_c00 = (_Base_ptr)((ulong)p_Stack_c00 & 0xffffffff00000000);
  local_bf8 = (_Base_ptr)0x0;
  local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poStack_c20 = (pointer)0x0;
  local_c18 = (pointer)0x0;
  p_Stack_c10 = (_Base_ptr)0x0;
  local_be0 = 0;
  local_bd8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_bd8._M_impl.super__Rb_tree_header._M_header;
  local_bd8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_bd8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_bd8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_ba8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_ba8._M_impl.super__Rb_tree_header._M_header;
  local_ba8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_ba8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b78 = 0x100;
  local_b70._M_p = (pointer)&local_b60;
  local_b68 = 0;
  local_b60._M_local_buf[0] = '\0';
  local_c58 = (pointer)0x1c00000002;
  local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_be8 = local_bf0;
  local_bd8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_bd8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_ba8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_ba8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_9d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b70._M_p;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c78,0,0,
             "Usage: superfamiconv <command> [<options>]\n\nAvailable commands: palette, tiles, map or blank for \"shorthand mode\"\nInvoke with <command> --help for further help\n\nShorthand mode options:\n"
             ,0xb9);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"in-image","");
  local_da8 = CONCAT44(local_da8._4_4_,argc);
  local_9d0 = argv;
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Input: image","");
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b48,'i',
             &local_448,&local_468,&local_68,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"out-palette","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"Output: palette data","");
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b48 + 0x20)
             ,'p',&local_488,&local_4a8,&local_a8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"out-tiles","");
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Output: tile data","");
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b48 + 0x40)
             ,'t',&local_4c8,&local_4e8,&local_e8,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"out-map","");
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"Output: map data","");
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b48 + 0x60)
             ,'m',&local_508,&local_528,&local_128,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"out-palette-image","");
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"Output: palette image","");
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b48 + 0x80)
             ,'\0',&local_548,&local_568,&local_168,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,
                    CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                             local_168.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"out-palette-act","");
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5a8,"Output: photoshop palette","");
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,&local_aa8,'\0',&local_588,&local_5a8,&local_1a8,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
  }
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"out-tiles-image","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"Output: tiles image","");
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a88,'\0',
             &local_5c8,&local_5e8,&local_1e8,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"out-scaled-image","");
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_628,"Output: image scaled to destination colorspace","");
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,&local_a68,'\0',&local_608,&local_628,&local_228,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"mode","");
  local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"Mode <default: snes>","");
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_688,"snes","");
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Settings","");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d98,'M',
             &local_648,&local_668,&local_688,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_668._M_dataplus._M_p != &local_668.field_2) {
    operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_648._M_dataplus._M_p != &local_648.field_2) {
    operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
  }
  local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"bpp","");
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"Bits per pixel","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c78,(uint *)((long)&local_a48 + 4),'B',&local_6a8,&local_6c8,4,
             &local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
  }
  local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"tile-width","");
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"Tile width","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c78,&uStack_a40,'W',&local_6e8,&local_708,8,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
    operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
  }
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"tile-height","");
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"Tile height","");
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c78,&uStack_a3c,'H',&local_728,&local_748,8,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"no-remap","");
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"Don\'t remap colors","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Settings","");
  Options::AddSwitch((Options *)local_c78,&bStack_a38,'R',&local_768,&local_788,false,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"no-discard","");
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7c8,"Don\'t discard redundant tiles","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"Settings","");
  Options::AddSwitch((Options *)local_c78,&bStack_a37,'D',&local_7a8,&local_7c8,false,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"no-flip","");
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_808,"Don\'t discard using tile flipping","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"Settings","");
  Options::AddSwitch((Options *)local_c78,abStack_a36,'F',&local_7e8,&local_808,false,&local_328);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"tile-base-offset","");
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_848,"Tile base offset for map data","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Settings","");
  Options::Add<int>((Options *)local_c78,local_a34,'T',&local_828,&local_848,0,&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"palette-base-offset","");
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_888,"Palette base offset for map data","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"Settings","");
  Options::Add<int>((Options *)local_c78,local_a34 + 1,'P',&local_868,&local_888,0,&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"sprite-mode","");
  local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c8,"Apply sprite output settings","");
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Settings","");
  Options::AddSwitch((Options *)local_c78,local_a2c,'S',&local_8a8,&local_8c8,false,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
    operator_delete(local_8c8._M_dataplus._M_p,local_8c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"color-zero","");
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"Set color #0","");
  local_3a8._M_string_length = 0;
  local_3a8.field_2._M_local_buf[0] = '\0';
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Settings","");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c78,&local_a28,'\0',&local_8e8,&local_908,&local_3a8,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,
                    CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                             local_3a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"verbose","");
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"Verbose logging","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"_","");
  Options::AddSwitch((Options *)local_c78,&local_da9,'v',&local_928,&local_948,false,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"license","");
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"Show licenses","");
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"_","");
  Options::AddSwitch((Options *)local_c78,(bool *)&local_a08,'l',&local_968,&local_988,false,
                     &local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"help","");
  local_9c8._M_dataplus._M_p = (pointer)&local_9c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c8,"Show this help","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"_","");
  aVar33.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
  Options::AddSwitch((Options *)local_c78,(bool *)&local_ca8,'h',&local_9a8,&local_9c8,false,
                     &local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c8._M_dataplus._M_p != &local_9c8.field_2) {
    operator_delete(local_9c8._M_dataplus._M_p,local_9c8.field_2._M_allocated_capacity + 1);
  }
  argv_00 = local_9d0;
  iVar23 = (int)local_da8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  bVar19 = Options::Parse((Options *)local_c78,iVar23,argv_00);
  if (bVar19) {
    if ((iVar23 < 2) || ((undefined1)local_ca8._mode == snes)) {
      Options::Usage_abi_cxx11_((string *)local_d58,(Options *)local_c78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_d58._0_8_,local_d58._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d58._0_8_ != &local_d48) {
        operator_delete((void *)local_d58._0_8_,(ulong)(local_d48._M_allocated_capacity + 1));
      }
    }
    else {
      if ((undefined1)local_a08._mode != snes) {
        MVar22 = sfc::mode((string *)local_d98);
        MVar26 = pce_sprite;
        if (local_a2c[0] == false) {
          MVar26 = MVar22;
        }
        if (MVar22 != pce) {
          MVar26 = MVar22;
        }
        local_a48 = CONCAT44(local_a48._4_4_,MVar26);
        if (MVar26 == pce_sprite) {
          local_a2c[0] = true;
        }
        paVar37 = &local_d48;
        local_d58._0_8_ = paVar37;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"bpp","");
        p_Var32 = local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar18 = local_c18;
        uVar7 = local_d58._0_8_;
        poVar36 = poStack_c20;
        if (poStack_c20 != local_c18) {
LAB_00125aa8:
          iVar23 = strcmp(poVar36->name,(char *)uVar7);
          if (iVar23 != 0) goto code_r0x00125abc;
          aVar33.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
               &local_ba8._M_impl.super__Rb_tree_header;
          if (p_Var32 != (_Base_ptr)0x0) {
            iVar23 = poVar36->val;
            p_Var31 = (_Base_ptr)aVar33;
            do {
              p_Var28 = p_Var32;
              p_Var30 = p_Var31;
              _Var2 = p_Var28[1]._M_color;
              p_Var31 = p_Var28;
              if ((int)_Var2 < iVar23) {
                p_Var31 = p_Var30;
              }
              p_Var32 = (&p_Var28->_M_left)[(int)_Var2 < iVar23];
            } while ((&p_Var28->_M_left)[(int)_Var2 < iVar23] != (_Base_ptr)0x0);
            p_Var32 = (_Base_ptr)aVar33;
            if (p_Var31 != (_Base_ptr)aVar33.values_) {
              if ((int)_Var2 < iVar23) {
                p_Var28 = p_Var30;
              }
              p_Var32 = p_Var31;
              if (iVar23 < (int)p_Var28[1]._M_color) {
                p_Var32 = (_Base_ptr)aVar33;
              }
            }
            bVar19 = p_Var32 != (_Base_ptr)aVar33.values_;
            goto LAB_001264ec;
          }
        }
LAB_001264ea:
        bVar19 = false;
LAB_001264ec:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 != paVar37) {
          operator_delete((void *)uVar7,(ulong)(local_d48._M_allocated_capacity + 1));
        }
        if (!bVar19) {
          uVar25 = 4;
          if ((local_a48 & 0xffffffff) < 0x11) {
            uVar25 = *(undefined4 *)(&DAT_0015f608 + (local_a48 & 0xffffffff) * 4);
          }
          local_a48 = CONCAT44(uVar25,(Mode)local_a48);
        }
        local_d58._0_8_ = paVar37;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"tile-width","");
        p_Var32 = local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar18 = local_c18;
        uVar7 = local_d58._0_8_;
        poVar36 = poStack_c20;
        if (poStack_c20 != local_c18) {
LAB_00126566:
          iVar23 = strcmp(poVar36->name,(char *)uVar7);
          if (iVar23 != 0) goto code_r0x00126576;
          if (p_Var32 != (_Base_ptr)0x0) {
            iVar23 = poVar36->val;
            aVar33.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 &local_ba8._M_impl.super__Rb_tree_header;
            p_Var31 = (_Base_ptr)aVar33;
            do {
              p_Var28 = p_Var32;
              p_Var30 = p_Var31;
              _Var2 = p_Var28[1]._M_color;
              p_Var31 = p_Var28;
              if ((int)_Var2 < iVar23) {
                p_Var31 = p_Var30;
              }
              p_Var32 = (&p_Var28->_M_left)[(int)_Var2 < iVar23];
            } while ((&p_Var28->_M_left)[(int)_Var2 < iVar23] != (_Base_ptr)0x0);
            p_Var32 = (_Base_ptr)aVar33;
            if (p_Var31 != (_Base_ptr)aVar33.values_) {
              if ((int)_Var2 < iVar23) {
                p_Var28 = p_Var30;
              }
              p_Var32 = p_Var31;
              if (iVar23 < (int)p_Var28[1]._M_color) {
                p_Var32 = (_Base_ptr)aVar33;
              }
            }
            bVar19 = p_Var32 != (_Base_ptr)aVar33.values_;
            goto LAB_001265dc;
          }
        }
LAB_001265da:
        bVar19 = false;
LAB_001265dc:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 != paVar37) {
          operator_delete((void *)uVar7,(ulong)(local_d48._M_allocated_capacity + 1));
        }
        if (!bVar19) {
          uStack_a40 = (uint)((Mode)local_a48 == pce_sprite) * 8 + 8;
        }
        local_d58._0_8_ = paVar37;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"tile-height","");
        p_Var32 = local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar18 = local_c18;
        uVar7 = local_d58._0_8_;
        poVar36 = poStack_c20;
        if (poStack_c20 != local_c18) {
LAB_0012664e:
          iVar23 = strcmp(poVar36->name,(char *)uVar7);
          if (iVar23 != 0) goto code_r0x0012665e;
          if (p_Var32 != (_Base_ptr)0x0) {
            iVar23 = poVar36->val;
            aVar33.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 &local_ba8._M_impl.super__Rb_tree_header;
            p_Var31 = (_Base_ptr)aVar33;
            do {
              p_Var28 = p_Var32;
              p_Var30 = p_Var31;
              _Var2 = p_Var28[1]._M_color;
              p_Var31 = p_Var28;
              if ((int)_Var2 < iVar23) {
                p_Var31 = p_Var30;
              }
              p_Var32 = (&p_Var28->_M_left)[(int)_Var2 < iVar23];
            } while ((&p_Var28->_M_left)[(int)_Var2 < iVar23] != (_Base_ptr)0x0);
            p_Var32 = (_Base_ptr)aVar33;
            if (p_Var31 != (_Base_ptr)aVar33.values_) {
              if ((int)_Var2 < iVar23) {
                p_Var28 = p_Var30;
              }
              p_Var32 = p_Var31;
              if (iVar23 < (int)p_Var28[1]._M_color) {
                p_Var32 = (_Base_ptr)aVar33;
              }
            }
            bVar19 = p_Var32 != (_Base_ptr)aVar33.values_;
            goto LAB_001266c4;
          }
        }
LAB_001266c2:
        bVar19 = false;
LAB_001266c4:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 != paVar37) {
          operator_delete((void *)uVar7,(ulong)(local_d48._M_allocated_capacity + 1));
        }
        if (!bVar19) {
          uStack_a3c = (uint)((Mode)local_a48 == pce_sprite) * 8 + 8;
        }
        local_d58._0_8_ = paVar37;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d58,"no-flip","");
        p_Var32 = local_ba8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar18 = local_c18;
        uVar7 = local_d58._0_8_;
        poVar36 = poStack_c20;
        if (poStack_c20 != local_c18) {
LAB_00126736:
          iVar23 = strcmp(poVar36->name,(char *)uVar7);
          if (iVar23 != 0) goto code_r0x00126746;
          if (p_Var32 != (_Base_ptr)0x0) {
            iVar23 = poVar36->val;
            aVar33.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 &local_ba8._M_impl.super__Rb_tree_header;
            p_Var31 = (_Base_ptr)aVar33;
            do {
              p_Var28 = p_Var32;
              p_Var30 = p_Var31;
              _Var2 = p_Var28[1]._M_color;
              p_Var31 = p_Var28;
              if ((int)_Var2 < iVar23) {
                p_Var31 = p_Var30;
              }
              p_Var32 = (&p_Var28->_M_left)[(int)_Var2 < iVar23];
            } while ((&p_Var28->_M_left)[(int)_Var2 < iVar23] != (_Base_ptr)0x0);
            p_Var32 = (_Base_ptr)aVar33;
            if (p_Var31 != (_Base_ptr)aVar33.values_) {
              if ((int)_Var2 < iVar23) {
                p_Var28 = p_Var30;
              }
              p_Var32 = p_Var31;
              if (iVar23 < (int)p_Var28[1]._M_color) {
                p_Var32 = (_Base_ptr)aVar33;
              }
            }
            bVar19 = p_Var32 != (_Base_ptr)aVar33.values_;
            goto LAB_001267ac;
          }
        }
LAB_001267aa:
        bVar19 = false;
LAB_001267ac:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar7 != paVar37) {
          operator_delete((void *)uVar7,(ulong)(local_d48._M_allocated_capacity + 1));
        }
        if (!bVar19) {
          abStack_a36[0] = true;
          if ((Mode)local_a48 - snes < 0xe) {
            abStack_a36[0] = (bool)(&DAT_0015f64c)[(Mode)local_a48 - snes];
          }
        }
        if (local_a2c[0] == true) {
          bStack_a37 = true;
          abStack_a36[0] = true;
        }
        bVar38 = local_a28._M_string_length == 0;
        if (bVar38) {
          uVar29 = 0;
        }
        else {
          uVar29 = sfc::from_hexstring(&local_a28);
        }
        bVar38 = !bVar38;
        bVar19 = true;
        goto LAB_00125440;
      }
      local_d58._0_8_ = "0.11.0";
      local_d48._M_allocated_capacity = 0x15de4a;
      local_d38 = (pointer)0x15de74;
      fmt.size_ = 0x19;
      fmt.data_ = "\nSuperFamiconv {}\n{}\n\n{}\n";
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args.desc_ = 0xccc;
      ::fmt::v10::vprint(fmt,args);
    }
    bVar19 = false;
    uVar29 = 0;
    bVar38 = false;
    paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  }
  else {
    paVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x1;
    bVar19 = false;
    uVar29 = 0;
    bVar38 = false;
  }
LAB_00125440:
  iVar23 = (int)paVar37;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._M_p != local_9d8) {
    operator_delete(local_b70._M_p,
                    CONCAT71(local_b60._M_allocated_capacity._1_7_,local_b60._M_local_buf[0]) + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_ba8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_bd8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
               *)&local_c08);
  if (poStack_c20 != (pointer)0x0) {
    operator_delete(poStack_c20,(long)p_Stack_c10 - (long)poStack_c20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c50);
  MVar26 = extraout_EDX;
  if ((undefined1 *)local_c78._0_8_ != local_c78 + 0x10) {
    operator_delete((void *)local_c78._0_8_,(ulong)(local_c68._M_allocated_capacity + 1));
    MVar26 = extraout_EDX_00;
  }
  if ((undefined1 *)local_d98._0_8_ != local_d98 + 0x10) {
    operator_delete((void *)local_d98._0_8_,
                    CONCAT17(local_d98[0x17],
                             CONCAT16(local_d98[0x16],CONCAT24(local_d98._20_2_,local_d98._16_4_)))
                    + 1);
    MVar26 = extraout_EDX_01;
  }
  if (!bVar19) goto LAB_0012646f;
  if ((pointer)local_b48._8_8_ == (pointer)0x0) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar24,"Input image required");
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_da9 == true) {
    sfc::mode_abi_cxx11_((string *)local_c78,(sfc *)(local_a48 & 0xffffffff),MVar26);
    local_d58._0_8_ = local_c78._0_8_;
    local_d58._8_8_ = local_c78._8_8_;
    fmt_00.size_ = 0x23;
    fmt_00.data_ = "Performing conversion in \"{}\" mode\n";
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_00.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_00,args_00);
    if ((undefined1 *)local_c78._0_8_ != local_c78 + 0x10) {
      operator_delete((void *)local_c78._0_8_,(ulong)(local_c68._M_allocated_capacity + 1));
    }
  }
  sfc::Image::Image((Image *)local_c78,(string *)local_b48);
  if (local_da9 == true) {
    sfc::Image::description_abi_cxx11_((string *)local_d98,(Image *)local_c78);
    local_d48._M_allocated_capacity = local_d98._0_8_;
    local_d48._8_8_ = CONCAT44(local_d98._12_4_,local_d98._8_4_);
    local_d58._0_8_ = local_b48._0_8_;
    local_d58._8_8_ = local_b48._8_8_;
    fmt_01.size_ = 0x1c;
    fmt_01.data_ = "Loaded image from \"{}\" ({})\n";
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_01.desc_ = 0xdd;
    ::fmt::v10::vprint(fmt_01,args_01);
    if ((undefined1 *)local_d98._0_8_ != local_d98 + 0x10) {
      operator_delete((void *)local_d98._0_8_,
                      CONCAT17(local_d98[0x17],
                               CONCAT16(local_d98[0x16],CONCAT24(local_d98._20_2_,local_d98._16_4_))
                              ) + 1);
    }
  }
  if ((pointer)local_a68._M_string_length != (pointer)0x0) {
    sfc::Image::save_scaled((Image *)local_c78,&local_a68,(Mode)local_a48);
    if (local_da9 == true) {
      local_d58._0_8_ = local_a68._M_dataplus._M_p;
      local_d58._8_8_ = local_a68._M_string_length;
      fmt_02.size_ = 0x35;
      fmt_02.data_ = "Saved image scaled to destination colorspace to \"{}\"\n";
      args_02.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args_02.desc_ = 0xd;
      ::fmt::v10::vprint(fmt_02,args_02);
    }
  }
  if (((Mode)local_a48 == pce_sprite) &&
     (((local_c78._0_8_ & 0xf) != 0 || ((local_c78._0_8_ & 0xf00000000) != 0)))) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar24,"pce/sprite-mode requires image dimensions to be a multiple of 16");
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_ca8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1;
  local_ca8._max_colors_per_subpalette = 0;
  local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
  local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
  local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  local_ca8._col0 = 0;
  local_ca8._col0_is_shared = false;
  uVar20 = sfc::default_palette_count_for_mode((Mode)local_a48);
  uVar35 = 1;
  for (uVar21 = local_a48._4_4_; uVar34 = (uint)uVar35, uVar21 != 0; uVar21 = uVar21 - 1) {
    uVar35 = (ulong)(uVar34 * 2);
  }
  if (bStack_a38 == true) {
    if ((int)((ulong)((long)local_c38.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) == 0) {
      prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar24,"no-remap requires indexed color image");
      __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_da9 == true) {
      fmt_03.size_ = 0x32;
      fmt_03.data_ = "Mapping palette straight from indexed color image\n";
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_d58;
      ::fmt::v10::vprint(fmt_03,(format_args)(auVar3 << 0x40));
    }
    uVar14 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_3_;
    uVar13 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_5_;
    uVar12 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish._0_5_;
    pSVar11 = local_ca8._subpalettes.
              super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_d58._0_8_ = CONCAT44(uVar20,(int)local_a48);
    local_d58._8_4_ = uVar34;
    local_d30 = (pointer)((ulong)local_d30._5_3_ << 0x28);
    uVar8 = CONCAT35(local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._5_3_,
                     local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_5_);
    uVar7 = CONCAT35(local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_finish._5_3_,
                     local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_finish._0_5_);
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    local_d98._0_4_ = SUB84(pSVar11,0);
    local_d98._4_4_ = (undefined4)((ulong)pSVar11 >> 0x20);
    local_d98._8_4_ = (undefined4)uVar12;
    local_d98._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    local_d98._16_4_ = (undefined4)uVar13;
    local_d98._20_2_ = (undefined2)((ulong)uVar8 >> 0x20);
    local_d98[0x16] = (undefined1)((uint3)uVar14 >> 8);
    local_d98[0x17] = (undefined1)((uint3)uVar14 >> 0x10);
    local_d48._M_allocated_capacity = 0;
    local_d48._8_8_ = 0;
    local_d38 = (pointer)0x0;
    local_ca8._0_8_ = local_d58._0_8_;
    local_ca8._max_colors_per_subpalette = uVar34;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_d98);
    local_ca8._col0 = (rgba_t)local_d30;
    local_ca8._col0_is_shared = (bool)local_d30._4_1_;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)&local_d48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d58,&local_c38);
    sfc::Palette::add_colors(&local_ca8,(rgba_vec_t *)local_d58,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d58._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_d58._0_8_,local_d48._M_allocated_capacity - local_d58._0_8_);
    }
  }
  else {
    if (local_da9 == true) {
      local_d58._0_8_ = ZEXT48(uVar20);
      fmt_04.size_ = 0x2a;
      fmt_04.data_ = "Mapping optimized palette ({}x{} entries)\n";
      args_03.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args_03.desc_ = 0x22;
      local_d48._M_allocated_capacity = uVar35;
      ::fmt::v10::vprint(fmt_04,args_03);
    }
    uVar14 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_3_;
    uVar13 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_5_;
    uVar12 = local_ca8._subpalettes.
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish._0_5_;
    pSVar11 = local_ca8._subpalettes.
              super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_d58._0_8_ = CONCAT44(uVar20,(int)local_a48);
    local_d58._8_4_ = uVar34;
    local_d30 = (pointer)((ulong)local_d30._5_3_ << 0x28);
    uVar8 = CONCAT35(local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._5_3_,
                     local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_5_);
    uVar7 = CONCAT35(local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_finish._5_3_,
                     local_ca8._subpalettes.
                     super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                     super__Vector_impl_data._M_finish._0_5_);
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    local_ca8._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    local_d98._0_4_ = SUB84(pSVar11,0);
    local_d98._4_4_ = (undefined4)((ulong)pSVar11 >> 0x20);
    local_d98._8_4_ = (undefined4)uVar12;
    local_d98._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    local_d98._16_4_ = (undefined4)uVar13;
    local_d98._20_2_ = (undefined2)((ulong)uVar8 >> 0x20);
    local_d98[0x16] = (undefined1)((uint3)uVar14 >> 8);
    local_d98[0x17] = (undefined1)((uint3)uVar14 >> 0x10);
    local_d48._M_allocated_capacity = 0;
    local_d48._8_8_ = 0;
    local_d38 = (pointer)0x0;
    local_ca8._0_8_ = local_d58._0_8_;
    local_ca8._max_colors_per_subpalette = uVar34;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_d98);
    local_ca8._col0 = (rgba_t)local_d30;
    local_ca8._col0_is_shared = (bool)local_d30._4_1_;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)&local_d48);
    if (bVar38) {
      if (local_a2c[0] == false) {
LAB_001258ac:
        if (local_da9 == true) {
          local_d58._0_8_ =
               ZEXT48(uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 |
                      uVar29 << 0x18);
          local_d48._M_allocated_capacity = 0x15f1de;
          local_d38 = (pointer)0x8;
          fmt_17.size_ = 0x1c2;
          fmt_17.data_ = (char *)0xc;
          args_15.field_1.args_ = aVar33.args_;
          args_15.desc_ = (unsigned_long_long)local_d58;
          ::fmt::v10::vformat_abi_cxx11_((string *)local_d98,(v10 *)"{1}{0:0{2}x}",fmt_17,args_15);
          local_d58._0_8_ = CONCAT44(local_d98._4_4_,local_d98._0_4_);
          local_d58._8_8_ = CONCAT44(local_d98._12_4_,local_d98._8_4_);
          fmt_05.size_ = 0x19;
          fmt_05.data_ = "Setting color zero to {}\n";
          args_04.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
          args_04.desc_ = 0xd;
          ::fmt::v10::vprint(fmt_05,args_04);
          if ((undefined1 *)CONCAT44(local_d98._4_4_,local_d98._0_4_) != local_d98 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_d98._4_4_,local_d98._0_4_),
                            CONCAT17(local_d98[0x17],
                                     CONCAT16(local_d98[0x16],
                                              CONCAT24(local_d98._20_2_,local_d98._16_4_))) + 1);
          }
        }
      }
      else {
LAB_001259f6:
        uVar29 = 0;
        if (local_da9 == true) {
          uVar29 = 0;
          fmt_06.size_ = 0x22;
          fmt_06.data_ = "Setting color zero to transparent\n";
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_d58;
          ::fmt::v10::vprint(fmt_06,(format_args)(auVar4 << 0x40));
        }
      }
      sfc::Palette::prime_col0(&local_ca8,uVar29);
    }
    else {
      aVar33 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )0x1;
      sfc::Image::crop((Image *)local_d58,(Image *)local_c78,0,0,1,1,(Mode)local_a48);
      sfc::Image::rgba_data((rgba_vec_t *)local_d98,(Image *)local_d58);
      puVar6 = (uint *)CONCAT44(local_d98._4_4_,local_d98._0_4_);
      uVar29 = *puVar6;
      operator_delete(puVar6,CONCAT17(local_d98[0x17],
                                      CONCAT16(local_d98[0x16],
                                               CONCAT24(local_d98._20_2_,local_d98._16_4_))) -
                             (long)puVar6);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_d00);
      if (local_d18 != (_Base_ptr)0x0) {
        operator_delete(local_d18,(long)local_d08 - (long)local_d18);
      }
      if (local_d30 != (pointer)0x0) {
        operator_delete(local_d30,(long)local_d20 - (long)local_d30);
      }
      if ((char *)local_d48._M_allocated_capacity != (char *)0x0) {
        operator_delete((void *)local_d48._M_allocated_capacity,(long)local_d38 - local_d48._0_8_);
      }
      if (local_a2c[0] == true) goto LAB_001259f6;
      if ((gg < (Mode)local_a48) || ((0x18018U >> ((Mode)local_a48 & (gg|sms)) & 1) == 0))
      goto LAB_001258ac;
    }
    sfc::Image::crops(&local_48,(Image *)local_c78,uStack_a40,uStack_a3c,(Mode)local_a48);
    sfc::Palette::add_images(&local_ca8,&local_48);
    std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_48);
    sfc::Palette::sort(&local_ca8);
  }
  if (local_da9 == true) {
    sfc::Palette::description_abi_cxx11_((string *)local_d58,&local_ca8);
    local_d98._0_4_ = (undefined4)local_d58._0_8_;
    local_d98._4_4_ = SUB84(local_d58._0_8_,4);
    local_d98._8_4_ = (undefined4)local_d58._8_8_;
    local_d98._12_4_ = SUB84(local_d58._8_8_,4);
    fmt_07.size_ = 0x18;
    fmt_07.data_ = "Created palette with {}\n";
    args_05.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d98;
    args_05.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_07,args_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d58._0_8_ != &local_d48) {
      operator_delete((void *)local_d58._0_8_,(ulong)(local_d48._M_allocated_capacity + 1));
    }
  }
  bVar19 = bStack_a38;
  uVar9 = CONCAT11(abStack_a36[0],bStack_a37);
  uStack_da0 = CONCAT44(uStack_a3c,uStack_a40);
  local_da8 = local_a48;
  local_d98._24_4_ = sfc::max_tile_count_for_mode((Mode)local_a48);
  local_d98._0_4_ = 0;
  local_d98._4_4_ = (undefined4)local_da8;
  local_d98._8_4_ = (undefined4)(local_da8 >> 0x20);
  local_d98._12_4_ = (undefined4)uStack_da0;
  local_d98._16_4_ = (undefined4)((ulong)uStack_da0 >> 0x20);
  local_d98[0x16] = bVar19;
  local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d98._20_2_ = uVar9;
  sfc::Image::crops(&local_cc8,(Image *)local_c78,uStack_a40,uStack_a3c,(Mode)local_a48);
  pIVar10 = local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    image = local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      sfc::Tileset::add((Tileset *)local_d98,image,&local_ca8);
      image = image + 1;
    } while (image != pIVar10);
  }
  uVar35 = (ulong)(uint)local_d98._24_4_;
  if ((uVar35 != 0) &&
     (uVar27 = ((long)local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
     uVar35 <= uVar27 && uVar27 - uVar35 != 0)) {
    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d58._0_8_ =
         ZEXT48((uint)((int)((ulong)((long)local_d78.
                                           super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d78.
                                          super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x45d1745d));
    local_d48._M_allocated_capacity = (size_type)(uint)local_d98._24_4_;
    fmt_18.size_ = 0x22;
    fmt_18.data_ = (char *)0x3f;
    args_16.field_1.args_ = aVar33.args_;
    args_16.desc_ = (unsigned_long_long)local_d58;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_a08,
               (v10 *)"Tileset exceeds maximum size ({} entries generated, {} maximum)",fmt_18,
               args_16);
    std::runtime_error::runtime_error(prVar24,(string *)&local_a08);
    __cxa_throw(prVar24,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_da9 == true) {
    uVar35 = ((long)local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d78.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    if (bStack_a37 == true) {
      local_d58._0_8_ = uVar35 & 0xffffffff;
      fmt_08.size_ = 0x20;
      fmt_08.data_ = "Created tileset with {} entries\n";
      args_06.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args_06.desc_ = 2;
      ::fmt::v10::vprint(fmt_08,args_06);
    }
    else {
      local_d58._0_8_ = uVar35 & 0xffffffff;
      local_d48._M_allocated_capacity = (size_type)(uint)local_d98._0_4_;
      fmt_09.size_ = 0x49;
      fmt_09.data_ = "Created optimized tileset with {} entries (discarded {} redundant tiles)\n";
      args_07.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args_07.desc_ = 0x22;
      ::fmt::v10::vprint(fmt_09,args_07);
    }
  }
  std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_cc8);
  uVar29 = (uint)((int)local_c78._0_4_ % (int)uStack_a40 != 0);
  if ((int)local_c78._0_4_ < 0 == 0 < (int)uStack_a40) {
    uVar29 = 0;
  }
  uVar29 = uVar29 + (int)local_c78._0_4_ / (int)uStack_a40;
  uVar21 = (uint)((int)local_c78._4_4_ % (int)uStack_a3c != 0);
  if ((long)local_c78._0_8_ < 0 == 0 < (int)uStack_a3c) {
    uVar21 = 0;
  }
  uVar21 = uVar21 + (int)local_c78._4_4_ / (int)uStack_a3c;
  uVar20 = uVar21 * uStack_a3c;
  if ((uVar29 * uStack_a40 != local_c78._0_4_) || (uVar20 != local_c78._4_4_)) {
    sfc::Image::crop((Image *)local_d58,(Image *)local_c78,0,0,uVar29 * uStack_a40,uVar20,
                     (Mode)local_a48);
    pSVar11 = local_c58;
    uVar7 = local_c68._M_allocated_capacity;
    local_c78._0_8_ = local_d58._0_8_;
    local_c78._8_8_ = local_d58._8_8_;
    local_c68._M_allocated_capacity = local_d48._M_allocated_capacity;
    local_c68._8_8_ = local_d48._8_8_;
    local_c58 = local_d38;
    local_d48._M_allocated_capacity = 0;
    local_d48._8_8_ = 0;
    local_d38 = (pointer)0x0;
    if ((char *)uVar7 != (char *)0x0) {
      operator_delete((void *)uVar7,(long)pSVar11 - uVar7);
    }
    p_Var32 = local_c40;
    puVar15 = local_c50;
    local_c50 = local_d30;
    puStack_c48 = puStack_d28;
    local_c40 = local_d20;
    local_d30 = (pointer)0x0;
    puStack_d28 = (pointer)0x0;
    local_d20 = (_Base_ptr)0x0;
    if (puVar15 != (pointer)0x0) {
      operator_delete(puVar15,(long)p_Var32 - (long)puVar15);
    }
    puVar17 = local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    puVar16 = local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = &local_d18->_M_color;
    local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = &p_Stack_d10->_M_color;
    local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_d08;
    local_d18 = (_Base_ptr)0x0;
    p_Stack_d10 = (_Base_ptr)0x0;
    local_d08 = (pointer)0x0;
    if ((_Base_ptr)puVar16 != (_Base_ptr)0x0) {
      operator_delete(puVar16,(long)puVar17 - (long)puVar16);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             *)&poStack_c20);
    if (local_d00._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_d00._M_impl.super__Rb_tree_header;
      local_c18 = (pointer)CONCAT44(local_c18._4_4_,
                                    local_d00._M_impl.super__Rb_tree_header._M_header._M_color);
      p_Stack_c10 = local_d00._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_c08 = local_d00._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Stack_c00 = local_d00._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_d00._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           (_Base_ptr)&local_c18;
      local_bf8 = (_Base_ptr)local_d00._M_impl.super__Rb_tree_header._M_node_count;
      local_d00._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d00._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d00._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_d00._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d00);
    if (local_d18 != (_Base_ptr)0x0) {
      operator_delete(local_d18,(long)local_d08 - (long)local_d18);
    }
    if (local_d30 != (pointer)0x0) {
      operator_delete(local_d30,(long)local_d20 - (long)local_d30);
    }
    if ((char *)local_d48._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_d48._M_allocated_capacity,(long)local_d38 - local_d48._0_8_);
    }
  }
  sfc::Map::Map(&local_a08,(Mode)local_a48,uVar29,uVar21,uStack_a40,uStack_a3c);
  if ((Mode)local_a48 != pce_sprite) {
    sfc::Image::crops(&local_cc8,(Image *)local_c78,uStack_a40,uStack_a3c,(Mode)local_a48);
    if (local_da9 == true) {
      local_d58._0_8_ =
           ((long)local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
      local_d48._M_allocated_capacity = (size_type)uStack_a40;
      local_d38 = (pointer)(ulong)uStack_a3c;
      fmt_10.size_ = 0x24;
      fmt_10.data_ = "Mapping {} {}x{}px tiles from image\n";
      args_08.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
      args_08.desc_ = 0x224;
      ::fmt::v10::vprint(fmt_10,args_08);
    }
    if (local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar35 = 0;
      do {
        sfc::Map::add(&local_a08,
                      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar35,(Tileset *)local_d98,&local_ca8,
                      local_a48._4_4_,(uint)(uVar35 % (ulong)uVar29),(uint)(uVar35 / uVar29));
        uVar35 = (ulong)((int)uVar35 + 1);
        uVar27 = ((long)local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
      } while (uVar35 <= uVar27 && uVar27 - uVar35 != 0);
    }
    if (local_a34[0] != 0) {
      sfc::Map::add_base_offset(&local_a08,local_a34[0]);
    }
    if (local_a34[1] != 0) {
      sfc::Map::add_palette_base_offset(&local_a08,local_a34[1]);
    }
    std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_cc8);
  }
  if (((pointer)local_b48._40_8_ != (pointer)0x0) &&
     (sfc::Palette::save(&local_ca8,(string *)(local_b48 + 0x20)), local_da9 == true)) {
    local_d58._0_8_ = local_b48._32_8_;
    local_d58._8_8_ = local_b48._40_8_;
    fmt_11.size_ = 0x22;
    fmt_11.data_ = "Saved native palette data to \"{}\"\n";
    args_09.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_09.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_11,args_09);
  }
  if (((pointer)local_b48._72_8_ != (pointer)0x0) &&
     (sfc::Tileset::save((Tileset *)local_d98,(string *)(local_b48 + 0x40)), local_da9 == true)) {
    local_d58._0_8_ = local_b48._64_8_;
    local_d58._8_8_ = local_b48._72_8_;
    fmt_12.size_ = 0x1f;
    fmt_12.data_ = "Saved native tile data to \"{}\"\n";
    args_10.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_10.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_12,args_10);
  }
  if ((pointer)local_b48._104_8_ != (pointer)0x0) {
    if ((Mode)local_a48 == pce_sprite) {
      fmt_19.size_ = 0x2c;
      fmt_19.data_ = "Map output not available in pce_sprite mode\n";
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_d58;
      ::fmt::v10::vprint(_stderr,fmt_19,(format_args)(auVar5 << 0x40));
    }
    else {
      sfc::Map::save(&local_a08,(string *)(local_b48 + 0x60),false,0,0);
      if (local_da9 == true) {
        local_d58._0_8_ = local_b48._96_8_;
        local_d58._8_8_ = local_b48._104_8_;
        fmt_13.size_ = 0x1e;
        fmt_13.data_ = "Saved native map data to \"{}\"\n";
        args_11.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
        args_11.desc_ = 0xd;
        ::fmt::v10::vprint(fmt_13,args_11);
      }
    }
  }
  if (((pointer)local_aa8._M_string_length != (pointer)0x0) &&
     (sfc::Palette::save_act(&local_ca8,&local_aa8), local_da9 == true)) {
    local_d58._0_8_ = local_aa8._M_dataplus._M_p;
    local_d58._8_8_ = local_aa8._M_string_length;
    fmt_14.size_ = 0x20;
    fmt_14.data_ = "Saved photoshop palette to \"{}\"\n";
    args_12.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_12.desc_ = 0xd;
    ::fmt::v10::vprint(fmt_14,args_12);
  }
  if ((Image *)local_b48._136_8_ != (Image *)0x0) {
    sfc::Image::Image((Image *)local_d58,&local_ca8);
    sfc::Image::save((Image *)local_d58,(string *)(local_b48 + 0x80));
    if (local_da9 == true) {
      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_b48._128_8_;
      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_b48._136_8_;
      fmt_15.size_ = 0x1c;
      fmt_15.data_ = "Saved palette image to \"{}\"\n";
      args_13.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_cc8;
      args_13.desc_ = 0xd;
      ::fmt::v10::vprint(fmt_15,args_13);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d00);
    if (local_d18 != (_Base_ptr)0x0) {
      operator_delete(local_d18,(long)local_d08 - (long)local_d18);
    }
    if (local_d30 != (pointer)0x0) {
      operator_delete(local_d30,(long)local_d20 - (long)local_d30);
    }
    if ((char *)local_d48._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_d48._M_allocated_capacity,(long)local_d38 - local_d48._0_8_);
    }
  }
  if ((Image *)local_a88._8_8_ != (Image *)0x0) {
    sfc::Image::Image((Image *)local_d58,(Tileset *)local_d98,0x80);
    sfc::Image::save((Image *)local_d58,(string *)local_a88);
    if (local_da9 == true) {
      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a88._0_8_;
      local_cc8.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_a88._8_8_;
      fmt_16.size_ = 0x1c;
      fmt_16.data_ = "Saved tileset image to \"{}\"\n";
      args_14.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_cc8;
      args_14.desc_ = 0xd;
      ::fmt::v10::vprint(fmt_16,args_14);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d00);
    if (local_d18 != (_Base_ptr)0x0) {
      operator_delete(local_d18,(long)local_d08 - (long)local_d18);
    }
    if (local_d30 != (pointer)0x0) {
      operator_delete(local_d30,(long)local_d20 - (long)local_d30);
    }
    if ((char *)local_d48._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_d48._M_allocated_capacity,(long)local_d38 - local_d48._0_8_);
    }
  }
  if (local_a08._entries.super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a08._entries.
                    super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a08._entries.
                          super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a08._entries.
                          super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&local_d78);
  std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector(&local_ca8._subpalettes);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&poStack_c20);
  if ((_Base_ptr)
      local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c50 != (pointer)0x0) {
    operator_delete(local_c50,(long)local_c40 - (long)local_c50);
  }
  if ((char *)local_c68._M_allocated_capacity != (char *)0x0) {
    operator_delete((void *)local_c68._M_allocated_capacity,(long)local_c58 - local_c68._0_8_);
  }
  iVar23 = 0;
LAB_0012646f:
  Settings::~Settings((Settings *)local_b48);
  return iVar23;
code_r0x00125abc:
  poVar36 = poVar36 + 1;
  if (poVar36 == poVar18) goto LAB_001264ea;
  goto LAB_00125aa8;
code_r0x00126576:
  poVar36 = poVar36 + 1;
  if (poVar36 == poVar18) goto LAB_001265da;
  goto LAB_00126566;
code_r0x0012665e:
  poVar36 = poVar36 + 1;
  if (poVar36 == poVar18) goto LAB_001266c2;
  goto LAB_0012664e;
code_r0x00126746:
  poVar36 = poVar36 + 1;
  if (poVar36 == poVar18) goto LAB_001267aa;
  goto LAB_00126736;
}

Assistant:

int superfamiconv(int argc, char* argv[]) {
  Settings settings = {};
  bool verbose = false;
  bool col0_forced = false;
  rgba_t col0 = 0;

  try {
    bool help;
    bool license;
    std::string mode_str;

    Options options;
    options.IndentDescription = sfc::Constants::options_indent;

    // clang-format off
    options.Header =
      "Usage: superfamiconv <command> [<options>]\n\n"

      "Available commands: palette, tiles, map or blank for \"shorthand mode\"\n"
      "Invoke with <command> --help for further help\n\n"

      "Shorthand mode options:\n";

    options.Add(settings.in_image,            'i', "in-image",             "Input: image");
    options.Add(settings.out_palette,         'p', "out-palette",          "Output: palette data");
    options.Add(settings.out_tiles,           't', "out-tiles",            "Output: tile data");
    options.Add(settings.out_map,             'm', "out-map",              "Output: map data");
    options.Add(settings.out_palette_image,   '\0', "out-palette-image",    "Output: palette image");
    options.Add(settings.out_palette_act,     '\0', "out-palette-act",      "Output: photoshop palette");
    options.Add(settings.out_tiles_image,     '\0', "out-tiles-image",      "Output: tiles image");
    options.Add(settings.out_scaled_image,    '\0', "out-scaled-image",     "Output: image scaled to destination colorspace");

    options.Add(mode_str,                     'M', "mode",                 "Mode <default: snes>",              std::string("snes"), "Settings");
    options.Add(settings.bpp,                 'B', "bpp",                  "Bits per pixel",                    unsigned(4),         "Settings");
    options.Add(settings.tile_w,              'W', "tile-width",           "Tile width",                        unsigned(8),         "Settings");
    options.Add(settings.tile_h,              'H', "tile-height",          "Tile height",                       unsigned(8),         "Settings");
    options.AddSwitch(settings.no_remap,      'R', "no-remap",             "Don't remap colors",                false,               "Settings");
    options.AddSwitch(settings.no_discard,    'D', "no-discard",           "Don't discard redundant tiles",     false,               "Settings");
    options.AddSwitch(settings.no_flip,       'F', "no-flip",              "Don't discard using tile flipping", false,               "Settings");
    options.Add(settings.tile_base_offset,    'T', "tile-base-offset",     "Tile base offset for map data",     int(0),              "Settings");
    options.Add(settings.palette_base_offset, 'P', "palette-base-offset",  "Palette base offset for map data",  int(0),              "Settings");
    options.AddSwitch(settings.sprite_mode,   'S', "sprite-mode",          "Apply sprite output settings",      false,               "Settings");
    options.Add(settings.color_zero,          '\0', "color-zero",           "Set color #0", std::string(),                           "Settings");

    options.AddSwitch(verbose,                'v', "verbose",              "Verbose logging", false, "_");
    options.AddSwitch(license,                'l', "license",              "Show licenses",   false, "_");
    options.AddSwitch(help,                   'h', "help",                 "Show this help",  false, "_");
    // clang-format on

    if (!options.Parse(argc, argv))
      return 1;

    if (argc <= 1 || help) {
      std::cout << options.Usage();
      return 0;
    }

    if (license) {
      fmt::print("\nSuperFamiconv {}\n{}\n\n{}\n", sfc::about::VERSION, sfc::about::COPYRIGHT, sfc::about::LICENSE);
      return 0;
    }

    settings.mode = sfc::mode(mode_str);

    // Set pce_sprite mode and sprite_mode interchangeably
    if (settings.sprite_mode && settings.mode == sfc::Mode::pce)
      settings.mode = sfc::Mode::pce_sprite;
    if (settings.mode == sfc::Mode::pce_sprite)
      settings.sprite_mode = true;

    // Mode-specific defaults
    if (!options.WasSet("bpp"))
      settings.bpp = sfc::default_bpp_for_mode(settings.mode);
    if (!options.WasSet("tile-width"))
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("tile-height"))
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("no-flip"))
      settings.no_flip = !sfc::tile_flipping_allowed_for_mode(settings.mode);

    // Sprite mode defaults
    if (settings.sprite_mode) {
      settings.no_discard = settings.no_flip = true;
    }

    if (!settings.color_zero.empty()) {
      col0 = sfc::from_hexstring(settings.color_zero);
      col0_forced = true;
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  try {
    if (settings.in_image.empty())
      throw std::runtime_error("Input image required");

    if (verbose)
      fmt::print("Performing conversion in \"{}\" mode\n", sfc::mode(settings.mode));

    sfc::Image image(settings.in_image);
    if (verbose)
      fmt::print("Loaded image from \"{}\" ({})\n", settings.in_image, image.description());

    // Write color-scaled image
    if (!settings.out_scaled_image.empty()) {
      image.save_scaled(settings.out_scaled_image, settings.mode);
      if (verbose)
        fmt::print("Saved image scaled to destination colorspace to \"{}\"\n", settings.out_scaled_image);
    }

    if (settings.mode == sfc::Mode::pce_sprite) {
      if (image.width() % 16 || image.height() % 16)
        throw std::runtime_error("pce/sprite-mode requires image dimensions to be a multiple of 16");
    }

    // Make palette
    sfc::Palette palette;
    {
      unsigned palette_count = sfc::default_palette_count_for_mode(settings.mode);
      unsigned colors_per_palette = sfc::palette_size_at_bpp(settings.bpp);

      if (settings.no_remap) {
        if (image.palette_size() == 0)
          throw std::runtime_error("no-remap requires indexed color image");
        if (verbose)
          fmt::print("Mapping palette straight from indexed color image\n");

        palette = sfc::Palette(settings.mode, palette_count, colors_per_palette);
        palette.add_colors(image.palette());

      } else {
        if (verbose)
          fmt::print("Mapping optimized palette ({}x{} entries)\n", palette_count, colors_per_palette);

        palette = sfc::Palette(settings.mode, palette_count, colors_per_palette);

        col0 = col0_forced ? col0 : image.crop(0, 0, 1, 1, settings.mode).rgba_data()[0];

        if (settings.sprite_mode) {
          if (verbose)
            fmt::print("Setting color zero to transparent\n");
          palette.prime_col0(sfc::transparent_color);
        } else if (col0_forced || sfc::col0_is_shared_for_mode(settings.mode)) {
          if (verbose)
            fmt::print("Setting color zero to {}\n", sfc::to_hexstring(col0, true, true));
          palette.prime_col0(col0);
        }

        palette.add_images(image.crops(settings.tile_w, settings.tile_h, settings.mode));
        palette.sort();
      }
      if (verbose)
        fmt::print("Created palette with {}\n", palette.description());
    }

    // Make tileset
    sfc::Tileset tileset(settings.mode, settings.bpp, settings.tile_w, settings.tile_h, settings.no_discard, settings.no_flip,
                         settings.no_remap, sfc::max_tile_count_for_mode(settings.mode));
    {
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);

      for (auto& crop : crops)
        tileset.add(crop, &palette);
      if (tileset.is_full()) {
        throw std::runtime_error(
          fmt::format("Tileset exceeds maximum size ({} entries generated, {} maximum)", tileset.size(), tileset.max()));
      }
      if (verbose) {
        if (settings.no_discard) {
          fmt::print("Created tileset with {} entries\n", tileset.size());
        } else {
          fmt::print("Created optimized tileset with {} entries (discarded {} redundant tiles)\n", tileset.size(),
                     tileset.discarded_tiles);
        }
      }
    }

    // Make map
    unsigned map_width = sfc::div_ceil(image.width(), settings.tile_w);
    unsigned map_height = sfc::div_ceil(image.height(), settings.tile_h);

    if (map_width * settings.tile_w != image.width() || map_height * settings.tile_h != image.height()) {
      image = image.crop(0, 0, map_width * settings.tile_w, map_height * settings.tile_h, settings.mode);
    }

    sfc::Map map(settings.mode, map_width, map_height, settings.tile_w, settings.tile_h);
    if (settings.mode != sfc::Mode::pce_sprite) {
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);
      if (verbose)
        fmt::print("Mapping {} {}x{}px tiles from image\n", crops.size(), settings.tile_w, settings.tile_h);

      for (unsigned i = 0; i < crops.size(); ++i) {
        map.add(crops[i], tileset, palette, settings.bpp, i % map_width, i / map_width);
      }

      if (settings.tile_base_offset)
        map.add_base_offset(settings.tile_base_offset);

      if (settings.palette_base_offset)
        map.add_palette_base_offset(settings.palette_base_offset);
    }

    // Write data
    if (!settings.out_palette.empty()) {
      palette.save(settings.out_palette);
      if (verbose)
        fmt::print("Saved native palette data to \"{}\"\n", settings.out_palette);
    }

    if (!settings.out_tiles.empty()) {
      tileset.save(settings.out_tiles);
      if (verbose)
        fmt::print("Saved native tile data to \"{}\"\n", settings.out_tiles);
    }

    if (!settings.out_map.empty()) {
      if (settings.mode == sfc::Mode::pce_sprite) {
        fmt::print(stderr, "Map output not available in pce_sprite mode\n");
      } else {
        map.save(settings.out_map);
        if (verbose)
          fmt::print("Saved native map data to \"{}\"\n", settings.out_map);
      }
    }

    if (!settings.out_palette_act.empty()) {
      palette.save_act(settings.out_palette_act);
      if (verbose)
        fmt::print("Saved photoshop palette to \"{}\"\n", settings.out_palette_act);
    }

    if (!settings.out_palette_image.empty()) {
      sfc::Image palette_image(palette);
      palette_image.save(settings.out_palette_image);
      if (verbose)
        fmt::print("Saved palette image to \"{}\"\n", settings.out_palette_image);
    }

    if (!settings.out_tiles_image.empty()) {
      sfc::Image tileset_image(tileset);
      tileset_image.save(settings.out_tiles_image);
      if (verbose)
        fmt::print("Saved tileset image to \"{}\"\n", settings.out_tiles_image);
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  return 0;
}